

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::AllocateInlineCache(FunctionBody *this)

{
  Type *addr;
  ThreadContext *this_00;
  code *pcVar1;
  undefined8 size;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  BOOL BVar6;
  uint32 uVar7;
  PropertyId PVar8;
  undefined4 *puVar9;
  Recycler *pRVar10;
  void **ppvVar11;
  uchar *puVar12;
  void *pvVar13;
  RootObjectBase *this_01;
  PropertyRecord *pPVar14;
  InlineCache *pIVar15;
  void **ppvVar16;
  Type *addr_00;
  uint32 cacheId;
  uint cacheId_00;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 local_98 [8];
  TrackAllocData data;
  
  if ((this->inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1883,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar2) goto LAB_0076cf79;
    *puVar9 = 0;
  }
  uVar3 = GetCountField(this,InlineCacheCount);
  uVar4 = GetCountField(this,IsInstInlineCacheCount);
  uVar5 = uVar4 + uVar3;
  if (uVar5 != 0) {
    uVar18 = (ulong)uVar5;
    local_98 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x188b;
    data.plusSize = uVar18;
    pRVar10 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076cf79;
      *puVar9 = 0;
    }
    ppvVar11 = (void **)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                                  (pRVar10,uVar18 * 8);
    if (ppvVar11 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_0076cf79;
      *puVar9 = 0;
    }
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x188e;
    data.plusSize = uVar18;
    pRVar10 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076cf79;
      *puVar9 = 0;
    }
    puVar12 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar10,uVar18);
    if (puVar12 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_0076cf79;
      *puVar9 = 0;
    }
    addr = &this->m_inlineCacheTypes;
    data._32_8_ = uVar18;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->m_inlineCacheTypes).ptr = puVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    uVar4 = GetCountField(this,RootObjectLoadInlineCacheStart);
    if (uVar4 != 0) {
      uVar18 = 0;
      do {
        pvVar13 = new<Memory::InlineCacheAllocator>
                            (0x20,&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_scriptContext)->inlineCacheAllocator,0x776e3e);
        ppvVar11[uVar18] = pvVar13;
        uVar18 = uVar18 + 1;
      } while (uVar4 != uVar18);
    }
    this_01 = GetRootObject(this);
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
              threadContext;
    uVar7 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    cacheId = uVar4;
    if (uVar4 < uVar7) {
      ppvVar16 = ppvVar11 + uVar4;
      do {
        PVar8 = GetPropertyIdFromCacheId(this,uVar4);
        pPVar14 = ThreadContext::GetPropertyName(this_00,PVar8);
        pIVar15 = RootObjectBase::GetInlineCache(this_01,pPVar14,false,false);
        *ppvVar16 = pIVar15;
        ppvVar16 = ppvVar16 + 1;
        uVar4 = uVar4 + 1;
        cacheId = uVar7;
      } while (uVar7 != uVar4);
    }
    uVar4 = GetCountField(this,RootObjectStoreInlineCacheStart);
    cacheId_00 = cacheId;
    if (cacheId < uVar4) {
      ppvVar16 = ppvVar11 + cacheId;
      do {
        PVar8 = GetPropertyIdFromCacheId(this,cacheId);
        pPVar14 = ThreadContext::GetPropertyName(this_00,PVar8);
        pIVar15 = RootObjectBase::GetInlineCache(this_01,pPVar14,true,false);
        *ppvVar16 = pIVar15;
        ppvVar16 = ppvVar16 + 1;
        cacheId = cacheId + 1;
        cacheId_00 = uVar4;
      } while (uVar4 != cacheId);
    }
    uVar17 = cacheId_00;
    if (cacheId_00 < uVar3) {
      ppvVar16 = ppvVar11 + cacheId_00;
      do {
        PVar8 = GetPropertyIdFromCacheId(this,cacheId_00);
        pPVar14 = ThreadContext::GetPropertyName(this_00,PVar8);
        pIVar15 = RootObjectBase::GetInlineCache(this_01,pPVar14,false,true);
        *ppvVar16 = pIVar15;
        ppvVar16 = ppvVar16 + 1;
        cacheId_00 = cacheId_00 + 1;
        uVar17 = uVar3;
      } while (uVar3 != cacheId_00);
    }
    if (uVar17 < uVar5) {
      lVar19 = 0;
      do {
        pvVar13 = new<Memory::CacheAllocator>
                            (0x20,&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_scriptContext)->isInstInlineCacheAllocator,0x776d48);
        ppvVar11[(ulong)uVar17 + lVar19] = pvVar13;
        lVar19 = lVar19 + 1;
      } while (uVar5 - uVar17 != (int)lVar19);
    }
    size = data._32_8_;
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = data._32_8_;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x18b7;
    pRVar10 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0076cf79;
      *puVar9 = 0;
    }
    puVar12 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar10,size);
    if (puVar12 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0076cf79:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
    addr_00 = &this->inlineCaches;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = puVar12;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = ppvVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  return;
}

Assistant:

void FunctionBody::AllocateInlineCache()
    {
        Assert(this->inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + GetIsInstInlineCacheCount();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            void ** inlineCaches = RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(),
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    this->m_scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = this->GetRootObject();
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    this->m_scriptContext->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->inlineCaches = inlineCaches;
        }
    }